

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O2

double calc_kurtosis<double>
                 (size_t nrows,int *x,int ncat,size_t *buffer_cnt,double *buffer_prob,
                 MissingAction missing_action,CategSplit cat_split_type,Xoshiro256PP *rnd_generator)

{
  double dVar1;
  ulong uVar2;
  size_t cnt;
  ulong uVar3;
  size_t sVar4;
  long lVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double dVar11;
  UniformUnitInterval UStack_79;
  double dStack_78;
  double dStack_70;
  double dStack_68;
  double dStack_60;
  double dStack_58;
  double dStack_50;
  long lStack_48;
  double dStack_40;
  double dStack_38;
  
  for (lVar5 = 0; (long)ncat * 8 + 8 != lVar5; lVar5 = lVar5 + 8) {
    *(undefined8 *)((long)buffer_cnt + lVar5) = 0;
  }
  if (missing_action == Fail) {
    for (sVar4 = 0; nrows != sVar4; sVar4 = sVar4 + 1) {
      buffer_cnt[x[sVar4]] = buffer_cnt[x[sVar4]] + 1;
    }
  }
  else {
    for (sVar4 = 0; nrows != sVar4; sVar4 = sVar4 + 1) {
      lVar5 = (long)x[sVar4];
      if ((long)x[sVar4] < 0) {
        lVar5 = (long)ncat;
      }
      buffer_cnt[lVar5] = buffer_cnt[lVar5] + 1;
    }
  }
  uVar3 = nrows - buffer_cnt[ncat];
  dVar8 = -INFINITY;
  if (1 < uVar3) {
    auVar10._8_4_ = (int)(uVar3 >> 0x20);
    auVar10._0_8_ = uVar3;
    auVar10._12_4_ = 0x45300000;
    uVar2 = 0;
    uVar6 = 0;
    if (0 < ncat) {
      uVar6 = (ulong)(uint)ncat;
    }
    for (; uVar6 != uVar2; uVar2 = uVar2 + 1) {
      buffer_prob[uVar2] =
           (((double)CONCAT44(0x45300000,(int)(buffer_cnt[uVar2] >> 0x20)) - 1.9342813113834067e+25)
           + ((double)CONCAT44(0x43300000,(int)buffer_cnt[uVar2]) - 4503599627370496.0)) /
           ((auVar10._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0));
    }
    if (cat_split_type == SubSet) {
      lStack_48 = 0x32;
      dStack_78 = 0.0;
      for (lVar5 = 0; lVar5 != 0x32; lVar5 = lVar5 + 1) {
        dStack_38 = 0.0;
        dStack_60 = 0.0;
        dStack_68 = 0.0;
        dStack_70 = 0.0;
        for (uVar3 = 0; uVar6 != uVar3; uVar3 = uVar3 + 1) {
          dStack_40 = Xoshiro::UniformUnitInterval::operator()(&UStack_79,rnd_generator);
          dStack_50 = dStack_40 * dStack_40;
          dStack_58 = buffer_prob[uVar3];
          dStack_60 = fma(dStack_58,dStack_40,dStack_60);
          dStack_68 = fma(dStack_58,dStack_50,dStack_68);
          dStack_70 = fma(dStack_58,dStack_40 * dStack_50,dStack_70);
          dStack_38 = fma(dStack_58,dStack_50 * dStack_50,dStack_38);
        }
        dVar7 = dStack_60 * dStack_60;
        dVar8 = dStack_68 - dVar7;
        if (dVar8 <= 0.0) {
          lStack_48 = lStack_48 + -1;
        }
        else {
          dStack_78 = dStack_78 +
                      (dVar7 * dStack_60 * dStack_60 +
                      dStack_60 * -4.0 * dVar7 * dStack_60 +
                      dStack_68 * 6.0 * dVar7 + dStack_70 * -4.0 * dStack_60 + dStack_38) /
                      (dVar8 * dVar8);
        }
      }
      dVar8 = -INFINITY;
      if ((lStack_48 != 0) && ((ulong)ABS(dStack_78) < 0x7ff0000000000000)) {
        auVar9._8_4_ = (int)((ulong)lStack_48 >> 0x20);
        auVar9._0_8_ = lStack_48;
        auVar9._12_4_ = 0x45300000;
        if (dStack_78 <= 0.0) {
          dStack_78 = 0.0;
        }
        dVar8 = dStack_78 /
                ((auVar9._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)lStack_48) - 4503599627370496.0));
      }
    }
    else {
      dVar7 = 0.0;
      for (uVar3 = 0; uVar6 != uVar3; uVar3 = uVar3 + 1) {
        dVar1 = buffer_prob[uVar3];
        if ((dVar1 != 0.0) || (NAN(dVar1))) {
          dVar11 = dVar1 * dVar1;
          dVar7 = dVar7 + (dVar1 * dVar11 * dVar1 +
                          dVar1 * -4.0 * dVar1 * dVar11 +
                          dVar1 * 6.0 * dVar11 + dVar1 * -4.0 * dVar1 + dVar1) /
                          ((dVar1 - dVar11) * (dVar1 - dVar11));
        }
        else {
          ncat = ncat + -1;
        }
      }
      if ((1 < ncat) && ((ulong)ABS(dVar7) < 0x7ff0000000000000)) {
        if (dVar7 <= 0.0) {
          dVar7 = 0.0;
        }
        dVar8 = dVar7 / (double)ncat;
      }
    }
  }
  return dVar8;
}

Assistant:

double calc_kurtosis(size_t nrows, int x[], int ncat, size_t buffer_cnt[], double buffer_prob[],
                     MissingAction missing_action, CategSplit cat_split_type, RNG_engine &rnd_generator)
{
    size_t cnt = nrows;
    std::fill(buffer_cnt, buffer_cnt + ncat + 1, (size_t)0);

    if (missing_action == Fail)
    {
        for (size_t row = 0; row < nrows; row++)
            buffer_cnt[x[row]]++;
    }

    else
    {
        for (size_t row = 0; row < nrows; row++)
        {
            if (likely(x[row] >= 0))
                buffer_cnt[x[row]]++;
            else
                buffer_cnt[ncat]++;
        }
    }

    return calc_kurtosis_internal<ldouble_safe>(
                                  cnt, x, ncat, buffer_cnt, buffer_prob,
                                  missing_action, cat_split_type, rnd_generator);
}